

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manipulation.h
# Opt level: O0

RefNull * wasm::ExpressionManipulator::refNull<wasm::RefFunc>(RefFunc *target,HeapType type)

{
  BasicHeapType id;
  Type TVar1;
  HeapType local_30;
  Type local_28;
  RefNull *local_20;
  RefNull *ret;
  RefFunc *target_local;
  HeapType type_local;
  
  ret = (RefNull *)target;
  target_local = (RefFunc *)type.id;
  TVar1.id = (uintptr_t)convert<wasm::RefFunc,wasm::RefNull>(target);
  local_20 = (RefNull *)TVar1.id;
  id = HeapType::getBottom((HeapType *)&target_local);
  HeapType::HeapType(&local_30,id);
  Type::Type(&local_28,local_30,Nullable,Inexact);
  wasm::RefNull::finalize(TVar1);
  return local_20;
}

Assistant:

inline RefNull* refNull(InputType* target, HeapType type) {
  auto* ret = convert<InputType, RefNull>(target);
  ret->finalize(Type(type.getBottom(), Nullable));
  return ret;
}